

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O3

handle pybind11::detail::
       set_caster<std::unordered_set<kratos::Var*,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<kratos::Var*>>,kratos::Var*>
       ::
       cast<std::unordered_set<kratos::Var*,std::hash<kratos::Var*>,std::equal_to<kratos::Var*>,std::allocator<kratos::Var*>>>
                 (unordered_set<kratos::Var_*,_std::hash<kratos::Var_*>,_std::equal_to<kratos::Var_*>,_std::allocator<kratos::Var_*>_>
                  *src,return_value_policy policy,handle parent)

{
  int iVar1;
  handle hVar2;
  _Hash_node_base *p_Var3;
  pair<const_void_*,_const_pybind11::detail::type_info_*> pVar4;
  handle local_38;
  object value_;
  set s;
  
  set::set((set *)&value_);
  p_Var3 = (src->_M_h)._M_before_begin._M_nxt;
  if (p_Var3 != (_Hash_node_base *)0x0) {
    do {
      pVar4 = type_caster_base<kratos::Var>::src_and_type((itype *)p_Var3[1]._M_nxt);
      local_38 = type_caster_generic::cast
                           (pVar4.first,policy,parent,pVar4.second,(_func_void_ptr_void_ptr *)0x0,
                            (_func_void_ptr_void_ptr *)0x0,(void *)0x0);
      if (local_38.m_ptr == (PyObject *)0x0) {
LAB_00292b93:
        object::~object((object *)&local_38);
        hVar2.m_ptr = (PyObject *)0x0;
        goto LAB_00292b9e;
      }
      iVar1 = PySet_Add(value_.super_handle.m_ptr,local_38.m_ptr);
      if (iVar1 != 0) goto LAB_00292b93;
      object::~object((object *)&local_38);
      p_Var3 = p_Var3->_M_nxt;
    } while (p_Var3 != (_Hash_node_base *)0x0);
  }
  hVar2 = value_.super_handle.m_ptr;
  value_.super_handle.m_ptr = (handle)(PyObject *)0x0;
LAB_00292b9e:
  object::~object(&value_);
  return (handle)hVar2.m_ptr;
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Key>::policy(policy);
        pybind11::set s;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(key_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_ || !s.add(value_))
                return handle();
        }
        return s.release();
    }